

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenubar.cpp
# Opt level: O1

void __thiscall QMenuBar::keyPressEvent(QMenuBar *this,QKeyEvent *e)

{
  undefined8 uVar1;
  undefined8 uVar2;
  QMenuBarPrivate *this_00;
  QArrayData *pQVar3;
  ushort *puVar4;
  QRect *pQVar5;
  Data *pDVar6;
  byte bVar7;
  QKeyEvent QVar8;
  QAction *pQVar9;
  char cVar10;
  short sVar11;
  short sVar12;
  LayoutDirection LVar13;
  QAction *pQVar14;
  QMetaObject *pQVar15;
  qsizetype qVar16;
  QAction *pQVar17;
  int iVar18;
  QAction *pQVar19;
  QObject *action;
  ulong uVar20;
  QObject *pQVar21;
  long lVar22;
  long in_FS_OFFSET;
  bool bVar23;
  undefined1 auVar24 [16];
  int iVar25;
  int iVar26;
  QAction *local_98;
  QAction *local_90;
  QArrayData *local_68;
  storage_type_conflict *psStack_60;
  undefined1 *local_58;
  QStringView local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMenuBarPrivate **)&(this->super_QWidget).field_0x8;
  QMenuBarPrivate::updateGeometries(this_00);
  iVar18 = *(int *)(e + 0x40);
  pQVar15 = (QMetaObject *)this;
  LVar13 = QWidget::layoutDirection(&this->super_QWidget);
  iVar25 = iVar18;
  if (((LVar13 == RightToLeft) && (iVar25 = 0x1000014, iVar18 != 0x1000012)) &&
     (iVar25 = 0x1000012, iVar18 != 0x1000014)) {
    iVar25 = iVar18;
  }
  iVar18 = 0x1000012;
  if (iVar25 != 0x1000002) {
    iVar18 = iVar25;
  }
  iVar26 = 0x1000014;
  if (iVar25 != 0x1000001) {
    iVar26 = iVar18;
  }
  switch(iVar26) {
  case 0x1000012:
  case 0x1000014:
    pDVar6 = (this_00->currentAction).wp.d;
    if (((pDVar6 == (Data *)0x0) || (*(int *)(pDVar6 + 4) == 0)) ||
       ((this_00->currentAction).wp.value == (QObject *)0x0)) goto LAB_0046eb36;
    QVar8 = (QKeyEvent)0x0;
    qVar16 = QtPrivate::indexOf<QAction*,QPointer<QAction>>
                       (&(this_00->super_QWidgetPrivate).actions,&this_00->currentAction,0);
    pQVar15 = (QMetaObject *)this_00;
    pQVar14 = QMenuBarPrivate::getNextAction
                        (this_00,(int)qVar16,(uint)(iVar26 != 0x1000012) * 2 + -1);
    if (pQVar14 == (QAction *)0x0) break;
    pQVar15 = (QMetaObject *)this_00;
    QMenuBarPrivate::setCurrentAction(this_00,pQVar14,(bool)(this_00->field_0x2a0 & 1),true);
    goto LAB_0046ee82;
  case 0x1000013:
  case 0x1000015:
    goto switchD_0046ea18_caseD_1000013;
  default:
    if ((1 < iVar26 + 0xfefffffcU) && (iVar26 != 0x20)) goto LAB_0046eb36;
switchD_0046ea18_caseD_1000013:
    pQVar15 = (QMetaObject *)QWidget::style(&this->super_QWidget);
    QVar8 = (QKeyEvent)0x0;
    iVar18 = (**(code **)(*(long *)&((QMenuBarPrivate *)pQVar15)->super_QWidgetPrivate + 0xf0))
                       (pQVar15,0x12,0,this,0);
    if (iVar18 != 0) {
      pDVar6 = (this_00->currentAction).wp.d;
      if (((pDVar6 == (Data *)0x0) || (*(int *)(pDVar6 + 4) == 0)) ||
         ((this_00->currentAction).wp.value == (QObject *)0x0)) {
LAB_0046eb36:
        QVar8 = (QKeyEvent)0x0;
      }
      else {
        QAction::menuObject();
        pQVar15 = &QMenu::staticMetaObject;
        lVar22 = QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
        if (lVar22 == 0) {
          QVar8 = (QKeyEvent)0x1;
          if ((iVar26 + 0xfefffffcU < 2) || (iVar26 == 0x20)) {
            pDVar6 = (this_00->currentAction).wp.d;
            if ((pDVar6 == (Data *)0x0) || (*(int *)(pDVar6 + 4) == 0)) {
              pQVar21 = (QObject *)0x0;
            }
            else {
              pQVar21 = (this_00->currentAction).wp.value;
            }
            action = (QObject *)0x0;
            QMenuBarPrivate::activateAction(this_00,(QAction *)pQVar21,Trigger);
            pDVar6 = (this_00->currentAction).wp.d;
            if (pDVar6 != (Data *)0x0) {
              if (*(int *)(pDVar6 + 4) == 0) {
                action = (QObject *)0x0;
              }
              else {
                action = (this_00->currentAction).wp.value;
              }
            }
            QMenuBarPrivate::setCurrentAction(this_00,(QAction *)action,false,false);
            pQVar15 = (QMetaObject *)this_00;
            QMenuBarPrivate::setKeyboardMode(this_00,false);
          }
        }
        else {
          pDVar6 = (this_00->currentAction).wp.d;
          if ((pDVar6 == (Data *)0x0) || (*(int *)(pDVar6 + 4) == 0)) {
            pQVar21 = (QObject *)0x0;
          }
          else {
            pQVar21 = (this_00->currentAction).wp.value;
          }
          pQVar15 = (QMetaObject *)this_00;
          QMenuBarPrivate::popupAction(this_00,(QAction *)pQVar21,true);
LAB_0046ee82:
          QVar8 = (QKeyEvent)0x1;
        }
      }
    }
  }
  if ((!(bool)QVar8) &&
     (pQVar15 = (QMetaObject *)e, cVar10 = QKeyEvent::matches((StandardKey)e), cVar10 != '\0')) {
    QMenuBarPrivate::setCurrentAction(this_00,(QAction *)0x0,false,false);
    pQVar15 = (QMetaObject *)this_00;
    QMenuBarPrivate::setKeyboardMode(this_00,false);
    QVar8 = (QKeyEvent)0x1;
  }
  bVar7 = 1;
  if ((QVar8 == (QKeyEvent)0x0) &&
     ((iVar18 = QKeyEvent::modifiers(), iVar18 == 0 ||
      (pQVar15 = (QMetaObject *)e, uVar20 = QKeyEvent::modifiers(), (uVar20 & 0x18000000) != 0)))) {
    pQVar15 = *(QMetaObject **)(e + 0x28);
    lVar22 = *(long *)(e + 0x38);
    if ((QMenuBarPrivate *)pQVar15 != (QMenuBarPrivate *)0x0) {
      LOCK();
      *(int *)&((QMenuBarPrivate *)pQVar15)->super_QWidgetPrivate =
           *(int *)&((QMenuBarPrivate *)pQVar15)->super_QWidgetPrivate + 1;
      UNLOCK();
    }
    if (lVar22 == 1) {
      bVar23 = (this_00->field_0x2a0 & 1) == 0;
      bVar7 = 0;
    }
    else {
      bVar7 = 0;
      bVar23 = false;
    }
  }
  else {
    bVar23 = false;
  }
  if (!(bool)((QMenuBarPrivate *)pQVar15 == (QMenuBarPrivate *)0x0 | bVar7)) {
    LOCK();
    *(int *)&((QMenuBarPrivate *)pQVar15)->super_QWidgetPrivate =
         *(int *)&((QMenuBarPrivate *)pQVar15)->super_QWidgetPrivate + -1;
    UNLOCK();
    if (*(int *)&((QMenuBarPrivate *)pQVar15)->super_QWidgetPrivate == 0) {
      QArrayData::deallocate((QArrayData *)pQVar15,2,0x10);
    }
  }
  if (bVar23) {
    pQVar3 = *(QArrayData **)(e + 0x28);
    puVar4 = *(ushort **)(e + 0x30);
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    sVar11 = QChar::toUpper((uint)*puVar4);
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
    if ((this_00->super_QWidgetPrivate).actions.d.size == 0) {
      bVar23 = true;
      iVar18 = 0;
      pQVar14 = (QAction *)0x0;
      local_98 = (QAction *)0x0;
    }
    else {
      uVar20 = 0;
      lVar22 = 8;
      local_98 = (QAction *)0x0;
      local_90 = (QAction *)0x0;
      pQVar14 = (QAction *)0x0;
      iVar18 = 0;
      do {
        pQVar5 = (this_00->actionRects).d.ptr;
        uVar1 = *(undefined8 *)((long)pQVar5 + lVar22 + -8);
        uVar2 = *(undefined8 *)((long)&(pQVar5->x1).m_i + lVar22);
        iVar25 = -(uint)((int)uVar2 == (int)uVar1 + -1);
        iVar26 = -(uint)((int)((ulong)uVar2 >> 0x20) == (int)((ulong)uVar1 >> 0x20) + -1);
        auVar24._4_4_ = iVar25;
        auVar24._0_4_ = iVar25;
        auVar24._8_4_ = iVar26;
        auVar24._12_4_ = iVar26;
        iVar25 = movmskpd((int)pQVar5,auVar24);
        if (iVar25 != 3) {
          pQVar19 = (this_00->super_QWidgetPrivate).actions.d.ptr[uVar20];
          local_58 = &DAT_aaaaaaaaaaaaaaaa;
          local_68 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
          psStack_60 = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
          QAction::text();
          pQVar9 = local_90;
          if (local_58 != (undefined1 *)0x0) {
            local_48.m_size = (qsizetype)local_58;
            local_48.m_data = psStack_60;
            qVar16 = QStringView::indexOf(&local_48,(QChar)0x26,0,CaseSensitive);
            if (-1 < qVar16) {
              if ((local_68 == (QArrayData *)0x0) ||
                 (1 < (local_68->ref_)._q_value.super___atomic_base<int>._M_i)) {
                QString::reallocData((longlong)&local_68,(AllocationOption)local_58);
              }
              sVar12 = QChar::toUpper((uint)(ushort)psStack_60[qVar16 + 1]);
              if (sVar12 == sVar11) {
                if (pQVar14 == (QAction *)0x0) {
                  pQVar14 = pQVar19;
                }
                pDVar6 = (this_00->currentAction).wp.d;
                if ((pDVar6 == (Data *)0x0) || (*(int *)(pDVar6 + 4) == 0)) {
                  pQVar17 = (QAction *)0x0;
                }
                else {
                  pQVar17 = (QAction *)(this_00->currentAction).wp.value;
                }
                iVar18 = iVar18 + 1;
                pQVar9 = pQVar19;
                if (pQVar17 != pQVar19) {
                  if (local_90 == (QAction *)0x0) {
                    pQVar19 = local_98;
                  }
                  pQVar9 = local_90;
                  if (local_98 == (QAction *)0x0) {
                    local_98 = pQVar19;
                  }
                }
              }
            }
          }
          local_90 = pQVar9;
          if (local_68 != (QArrayData *)0x0) {
            LOCK();
            (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_68,2,0x10);
            }
          }
        }
        uVar20 = uVar20 + 1;
        lVar22 = lVar22 + 0x10;
      } while (uVar20 < (ulong)(this_00->super_QWidgetPrivate).actions.d.size);
      bVar23 = local_90 == (QAction *)0x0;
    }
    if (iVar18 < 1) {
      pQVar14 = (QAction *)0x0;
    }
    else if ((((iVar18 != 1) && (pDVar6 = (this_00->currentAction).wp.d, pDVar6 != (Data *)0x0)) &&
             (*(int *)(pDVar6 + 4) != 0)) && ((this_00->currentAction).wp.value != (QObject *)0x0))
    {
      if (local_98 != (QAction *)0x0) {
        pQVar14 = local_98;
      }
      if (bVar23) {
        pQVar14 = local_98;
      }
    }
    if (pQVar14 != (QAction *)0x0) {
      QMenuBarPrivate::setCurrentAction(this_00,pQVar14,true,true);
      QVar8 = (QKeyEvent)0x1;
    }
  }
  e[0xc] = QVar8;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMenuBar::keyPressEvent(QKeyEvent *e)
{
    Q_D(QMenuBar);
    d->updateGeometries();
    int key = e->key();
    if (isRightToLeft()) {  // in reverse mode open/close key for submenues are reversed
        if (key == Qt::Key_Left)
            key = Qt::Key_Right;
        else if (key == Qt::Key_Right)
            key = Qt::Key_Left;
    }
    if (key == Qt::Key_Tab) //means right
        key = Qt::Key_Right;
    else if (key == Qt::Key_Backtab) //means left
        key = Qt::Key_Left;

    bool key_consumed = false;
    switch(key) {
    case Qt::Key_Up:
    case Qt::Key_Down:
    case Qt::Key_Enter:
    case Qt::Key_Space:
    case Qt::Key_Return: {
        if (!style()->styleHint(QStyle::SH_MenuBar_AltKeyNavigation, nullptr, this) || !d->currentAction)
           break;
        if (d->currentAction->menu()) {
            d->popupAction(d->currentAction, true);
        } else if (key == Qt::Key_Enter || key == Qt::Key_Return || key == Qt::Key_Space) {
            d->activateAction(d->currentAction, QAction::Trigger);
            d->setCurrentAction(d->currentAction, false);
            d->setKeyboardMode(false);
        }
        key_consumed = true;
        break; }

    case Qt::Key_Right:
    case Qt::Key_Left: {
        if (d->currentAction) {
            int index = d->actions.indexOf(d->currentAction);
            if (QAction *nextAction = d->getNextAction(index, key == Qt::Key_Left ? -1 : +1)) {
                d->setCurrentAction(nextAction, d->popupState, true);
                key_consumed = true;
            }
        }
        break; }

    default:
        key_consumed = false;
    }

#ifndef QT_NO_SHORTCUT
    if (!key_consumed && e->matches(QKeySequence::Cancel)) {
        d->setCurrentAction(nullptr);
        d->setKeyboardMode(false);
        key_consumed = true;
    }
#endif

    if (!key_consumed &&
       (!e->modifiers() ||
        (e->modifiers()&(Qt::MetaModifier|Qt::AltModifier))) && e->text().size()==1 && !d->popupState) {
        int clashCount = 0;
        QAction *first = nullptr, *currentSelected = nullptr, *firstAfterCurrent = nullptr;
        {
            const QChar c = e->text().at(0).toUpper();
            for(int i = 0; i < d->actions.size(); ++i) {
                if (d->actionRects.at(i).isNull())
                    continue;
                QAction *act = d->actions.at(i);
                QString s = act->text();
                if (!s.isEmpty()) {
                    qsizetype ampersand = s.indexOf(u'&');
                    if (ampersand >= 0) {
                        if (s[ampersand+1].toUpper() == c) {
                            clashCount++;
                            if (!first)
                                first = act;
                            if (act == d->currentAction)
                                currentSelected = act;
                            else if (!firstAfterCurrent && currentSelected)
                                firstAfterCurrent = act;
                        }
                    }
                }
            }
        }
        QAction *next_action = nullptr;
        if (clashCount >= 1) {
            if (clashCount == 1 || !d->currentAction || (currentSelected && !firstAfterCurrent))
                next_action = first;
            else
                next_action = firstAfterCurrent;
        }
        if (next_action) {
            key_consumed = true;
            d->setCurrentAction(next_action, true, true);
        }
    }
    if (key_consumed)
        e->accept();
    else
        e->ignore();
}